

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O1

int VP8EncStartAlpha(VP8Encoder *enc)

{
  int iVar1;
  int iVar2;
  WebPWorkerInterface *pWVar3;
  void *in_RSI;
  
  iVar2 = 1;
  if (enc->has_alpha_ != 0) {
    if (enc->thread_level_ < 1) {
      iVar2 = CompressAlphaJob(enc,in_RSI);
      return iVar2;
    }
    pWVar3 = WebPGetWorkerInterface();
    iVar1 = (*pWVar3->Reset)(&enc->alpha_worker_);
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      pWVar3 = WebPGetWorkerInterface();
      (*pWVar3->Launch)(&enc->alpha_worker_);
    }
  }
  return iVar2;
}

Assistant:

int VP8EncStartAlpha(VP8Encoder* const enc) {
  if (enc->has_alpha_) {
    if (enc->thread_level_ > 0) {
      WebPWorker* const worker = &enc->alpha_worker_;
      // Makes sure worker is good to go.
      if (!WebPGetWorkerInterface()->Reset(worker)) {
        return 0;
      }
      WebPGetWorkerInterface()->Launch(worker);
      return 1;
    } else {
      return CompressAlphaJob(enc, NULL);   // just do the job right away
    }
  }
  return 1;
}